

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O2

uint32_t farmhashmk::Hash32Len0to4(char *s,size_t len,uint32_t seed)

{
  uint32_t uVar1;
  size_t i;
  size_t sVar2;
  uint h;
  
  h = 9;
  for (sVar2 = 0; len != sVar2; sVar2 = sVar2 + 1) {
    seed = seed * -0x3361d2af + (int)s[sVar2];
    h = h ^ seed;
  }
  uVar1 = util::Mur((uint32_t)len,h);
  uVar1 = util::Mur(seed,uVar1);
  uVar1 = util::fmix(uVar1);
  return uVar1;
}

Assistant:

STATIC_INLINE uint32_t Hash32Len0to4(const char *s, size_t len, uint32_t seed = 0) {
  uint32_t b = seed;
  uint32_t c = 9;
  for (size_t i = 0; i < len; i++) {
    signed char v = s[i];
    b = b * c1 + v;
    c ^= b;
  }
  return fmix(Mur(b, Mur(len, c)));
}